

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O1

void helicsFederateSetTimeRequestEntryCallback
               (HelicsFederate fed,
               _func_void_HelicsTime_HelicsTime_HelicsBool_void_ptr *requestTimeEntry,void *userdata
               ,HelicsError *err)

{
  Federate *this;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  _Any_data local_38;
  code *local_28;
  undefined8 uStack_20;
  
  this = getFed(fed,err);
  if (this != (Federate *)0x0) {
    if (requestTimeEntry == (_func_void_HelicsTime_HelicsTime_HelicsBool_void_ptr *)0x0) {
      local_28 = (code *)0x0;
      uStack_20 = 0;
      local_38._M_unused._M_object = (void *)0x0;
      local_38._8_8_ = 0;
      helics::Federate::setTimeRequestEntryCallback
                (this,(function<void_(TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_bool)>
                       *)&local_38);
      if (local_28 != (code *)0x0) {
        (*local_28)(&local_38,&local_38,__destroy_functor);
      }
    }
    else {
      pcStack_40 = std::
                   _Function_handler<void_(TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/shared_api_library/FederateExport.cpp:1258:17)>
                   ::_M_invoke;
      local_48 = std::
                 _Function_handler<void_(TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/shared_api_library/FederateExport.cpp:1258:17)>
                 ::_M_manager;
      local_58._M_unused._0_8_ = (undefined8)requestTimeEntry;
      local_58._8_8_ = userdata;
      helics::Federate::setTimeRequestEntryCallback
                (this,(function<void_(TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_bool)>
                       *)&local_58);
      if (local_48 != (code *)0x0) {
        (*local_48)(&local_58,&local_58,__destroy_functor);
      }
    }
  }
  return;
}

Assistant:

void helicsFederateSetTimeRequestEntryCallback(
    HelicsFederate fed,
    void (*requestTimeEntry)(HelicsTime currentTime, HelicsTime requestTime, HelicsBool iterating, void* userdata),
    void* userdata,
    HelicsError* err)
{
    auto* fedptr = getFed(fed, err);
    if (fedptr == nullptr) {
        return;
    }

    try {
        if (requestTimeEntry == nullptr) {
            fedptr->setTimeRequestEntryCallback({});
        } else {
            fedptr->setTimeRequestEntryCallback(
                [requestTimeEntry, userdata](helics::Time currentTime, helics::Time requestTime, bool iterating) {
                    requestTimeEntry(currentTime, requestTime, (iterating) ? HELICS_TRUE : HELICS_FALSE, userdata);
                });
        }
    }
    catch (...) {  // LCOV_EXCL_LINE
        helicsErrorHandler(err);  // LCOV_EXCL_LINE
    }
}